

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxemu.cpp
# Opt level: O0

bool keys(void)

{
  bool bVar1;
  undefined1 local_89;
  undefined1 local_88 [7];
  char m_1;
  uchar local_61;
  char m;
  undefined1 local_30 [40];
  int ch;
  
  local_30._32_4_ = wgetch(_stdscr);
  if (local_30._32_4_ == 9) {
    awin = awin == '\0';
  }
  else if (local_30._32_4_ == 10) {
    local_30._32_4_ = 0;
  }
  else if (local_30._32_4_ == 0x20) {
    if ((running & 1U) == 0) {
      Cpu::lookup_abi_cxx11_((Cpu *)local_30);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_30,"END");
      std::__cxx11::string::~string((string *)local_30);
      if (bVar1) {
        Cpu::reset(&cpu);
      }
      Cpu::execute(&cpu);
      romr = (uint)*pc * 0x23;
      cursorrow = (uint)romr / 0x23;
    }
  }
  else if (local_30._32_4_ == 0x52) {
    running = false;
    Cpu::reset(&cpu);
  }
  else if (local_30._32_4_ == 0x62) {
    breakpoint[cursorrow] = (bool)((breakpoint[cursorrow] ^ 0xffU) & 1);
  }
  else if (local_30._32_4_ == 0x72) {
    Cpu::lookup_abi_cxx11_((Cpu *)&stack0xffffffffffffffa0);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &stack0xffffffffffffffa0,"END");
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
    if (bVar1) {
      Cpu::reset(&cpu);
    }
    if ((running & 1U) == 0) {
      running = true;
      local_61 = 'r';
      pthread_create(&walkthread,(pthread_attr_t *)0x0,run,&stack0xffffffffffffff9f);
    }
    else {
      running = false;
    }
  }
  else if (local_30._32_4_ == 0x77) {
    Cpu::lookup_abi_cxx11_((Cpu *)local_88);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_88,"END");
    std::__cxx11::string::~string((string *)local_88);
    if (bVar1) {
      Cpu::reset(&cpu);
    }
    if ((running & 1U) == 0) {
      running = true;
      local_89 = 0x77;
      pthread_create(&walkthread,(pthread_attr_t *)0x0,run,&local_89);
    }
    else {
      running = false;
    }
  }
  else if (local_30._32_4_ == 0x102) {
    if (awin == '\0') {
      if ((cursorrow < 0xfff) &&
         (cursorrow = cursorrow + 1, romr + (row + -2) * 0x23 <= cursorrow * 0x23)) {
        romr = romr + 0x23;
      }
    }
    else {
      ramr = ramr + 0x35;
    }
  }
  else if (local_30._32_4_ == 0x103) {
    if (awin == '\0') {
      if ((0 < cursorrow) && (cursorrow = cursorrow + -1, cursorrow * 0x23 < romr)) {
        romr = romr + -0x23;
      }
    }
    else {
      ramr = ramr + -0x35;
    }
  }
  else if (local_30._32_4_ == 0x152) {
    if (awin == '\0') {
      romr = romr + (row + -2) * 0x23;
      cursorrow = romr / 0x23;
    }
    else {
      ramr = ramr + (row / 2 + -2) * 0x35;
    }
  }
  else if (local_30._32_4_ == 0x153) {
    if (awin == '\0') {
      romr = romr + (row + -2) * -0x23;
      cursorrow = romr / 0x23;
    }
    else {
      ramr = ramr + (row / 2 + -2) * -0x35;
    }
  }
  if (local_30._32_4_ == 0) {
    local_30[0x27] = false;
  }
  else {
    if (romr < 0) {
      romr = 0;
      cursorrow = 0;
    }
    if (ramr < 0) {
      ramr = 0;
    }
    if (0x1000 < romr / 0x23 + row + -2) {
      romr = (0x1002 - row) * 0x23;
    }
    if (0x20 < ramr / 0x35 + row / 2 + -2) {
      ramr = (0x22 - row / 2) * 0x35;
    }
    local_30[0x27] = true;
  }
  return local_30[0x27];
}

Assistant:

bool keys()
{
	int ch = getch();
	switch (ch)
	{
			case KEY_UP:
			if (awin == 0)
			{
				if (cursorrow > 0)
				{
					cursorrow--;
					if (cursorrow*35 < romr)romr -= 35;
				}
			}
			else ramr = ramr - 53;
			break;
			case KEY_PPAGE:
			if (awin == 0)
			{
				romr = romr - (row - 2) * 35;
				cursorrow = romr / 35;
			}
			else
				ramr = ramr - (row / 2 - 2) * 53;

			break;
			case KEY_DOWN:
			if (awin == 0)
			{
				if (cursorrow < 4095)
				{
					cursorrow++;
					if (cursorrow*35 >= romr + (row - 2) * 35)romr += 35;
				}
			}
			else
				ramr = ramr + 53;
			break;
			case KEY_NPAGE:
			if (awin == 0)
			{
				romr = romr + (row - 2) * 35;
				cursorrow = romr / 35;
			}
			else ramr = ramr + (row / 2 - 2) * 53;
			break;
			case 10:      // enter
			ch = 0;
			break;
			case 32:      // space
			if (!running)
			{
				if (cpu.lookup() == "END")
				{
					cpu.reset();
				}
				cpu.execute();
				romr = 35 * (*pc);
				cursorrow = romr / 35;
			}
			break;
			case 9:      //tab
			if (awin == 0)awin = 1;
			else awin = 0;
			break;
			case 'r':
			if (cpu.lookup() == "END")
			{
				cpu.reset();
			}
			if (!running)
			{
				running = true;
				char m = 'r';
				pthread_create( &walkthread, NULL, &run, &m);
			}
			else running = false;
			break;
			case 'R':
			running = false;
			cpu.reset();
			break;
			case 'w':
			if (cpu.lookup() == "END")
			{
				cpu.reset();
			}
			if (!running)
			{
				running = true;
				char m = 'w';
				pthread_create( &walkthread, NULL, &run, &m);
			}
			else running = false;
			break;
			case 'b':
				breakpoint[cursorrow] = !breakpoint[cursorrow];
			break;
	}
	if (ch == 0) return false;
	if (romr < 0)
	{
		romr = 0;
		cursorrow = 0;
	}
	if (ramr < 0)ramr = 0;
	if ((romr / 35 + row - 2) > 4096)romr = (4096 - row + 2) * 35;
	if ((ramr / 53 + row / 2 - 2) > 32)ramr = (32 - row / 2 + 2) * 53;
	return true;
}